

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snew(ASMState *as,IRIns *ir)

{
  undefined2 uVar1;
  RegCost RVar2;
  ASMState *in_RSI;
  long in_RDI;
  IRRef args [3];
  CCallInfo *ci;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  IRIns *ir_00;
  
  ir_00 = (IRIns *)(lj_ir_callinfo + 2);
  asm_snap_prep((ASMState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  RVar2 = in_RSI->cost[0];
  uVar1 = *(undefined2 *)((long)in_RSI->cost + 2);
  *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) + 1;
  asm_setupresult(in_RSI,ir_00,(CCallInfo *)(ulong)CONCAT24(uVar1,(uint)(ushort)RVar2));
  asm_gencall((ASMState *)&ir->field_0,ci,(IRRef *)args._4_8_);
  return;
}

Assistant:

static void asm_snew(ASMState *as, IRIns *ir)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_str_new];
  IRRef args[3];
  asm_snap_prep(as);
  args[0] = ASMREF_L;  /* lua_State *L    */
  args[1] = ir->op1;   /* const char *str */
  args[2] = ir->op2;   /* size_t len      */
  as->gcsteps++;
  asm_setupresult(as, ir, ci);  /* GCstr * */
  asm_gencall(as, ci, args);
}